

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjpeghandler.cpp
# Opt level: O0

bool do_write_jpeg_image(jpeg_compress_struct *cinfo,JSAMPROW *row_pointer,QImage *image,
                        QIODevice *device,int sourceQuality,QString *description,bool optimize,
                        bool progressive,bool invertCMYK)

{
  bool bVar1;
  int iVar2;
  undefined4 uVar3;
  int iVar4;
  my_jpeg_destination_mgr *this;
  undefined8 uVar5;
  int *piVar6;
  void *pvVar7;
  const_reference puVar8;
  QIODevice *in_RCX;
  ulong uVar9;
  EVP_PKEY_CTX *in_RDX;
  QImage *pQVar10;
  undefined8 *in_RSI;
  undefined8 *in_RDI;
  int in_R8D;
  long in_FS_OFFSET;
  bool bVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  byte in_stack_00000008;
  byte in_stack_00000010;
  byte in_stack_00000018;
  int i_9;
  QRgb *rgb_1;
  int i_8;
  quint32 *cmykOut;
  quint32 *cmykIn;
  int i_7;
  QRgb *rgb;
  int i_6;
  uchar *pix_1;
  int i_5;
  uchar *pix;
  bool bit_3;
  int i_4;
  bool bit_2;
  int i_3;
  uchar *data_1;
  bool bit_1;
  int i_2;
  bool bit;
  int i_1;
  uchar *data;
  uchar *row;
  int w;
  int quality;
  qreal diffCm;
  qreal diffInch;
  int i;
  bool gray;
  my_jpeg_destination_mgr *iod_dest;
  bool success;
  QImage rowImg_1;
  QImage rowImg;
  QList<unsigned_int> cmap;
  my_error_mgr jerr;
  undefined4 in_stack_fffffffffffffc48;
  ImageConversionFlag in_stack_fffffffffffffc4c;
  undefined4 in_stack_fffffffffffffc50;
  QRgb in_stack_fffffffffffffc54;
  j_compress_ptr in_stack_fffffffffffffc58;
  QImage *in_stack_fffffffffffffc60;
  j_compress_ptr in_stack_fffffffffffffc70;
  QImage *in_stack_fffffffffffffc78;
  QFlagsStorage<Qt::ImageConversionFlag> QVar16;
  int local_37c;
  int local_31c;
  QRgb *local_318;
  int local_30c;
  int local_2f4;
  QRgb *local_2f0;
  int local_2e4;
  int local_2d4;
  int local_2c4;
  int local_2bc;
  int local_2ac;
  int local_2a4;
  QImage *local_298;
  int local_278;
  bool local_264;
  bool local_22d;
  QImage local_228 [24];
  undefined8 local_210;
  undefined8 local_208;
  undefined8 local_200;
  QImage local_1f0 [24];
  undefined8 local_1d8;
  undefined8 local_1d0;
  undefined8 local_1c8;
  int local_1c0;
  int local_1bc;
  double local_1b8;
  double local_1b0;
  double local_1a8;
  double local_1a0 [4];
  code *local_180 [2];
  code *local_170;
  __jmp_buf_tag _Stack_d8;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_1a0[1] = -3.7206620809969885e-103;
  local_1a0[2] = -3.7206620809969885e-103;
  local_1a0[3] = -3.7206620809969885e-103;
  QImage::colorTable();
  iVar2 = QImage::format();
  if ((iVar2 == 0) || (iVar2 = QImage::format(), iVar2 == 0x17)) {
    local_22d = false;
  }
  else {
    this = (my_jpeg_destination_mgr *)operator_new(0x1030);
    my_jpeg_destination_mgr::my_jpeg_destination_mgr(this,in_RCX);
    memset(local_180,0xaa,0x170);
    uVar5 = jpeg_std_error(local_180);
    *in_RDI = uVar5;
    local_180[0] = my_error_exit;
    local_170 = my_output_message;
    iVar2 = _setjmp(&_Stack_d8);
    if (iVar2 == 0) {
      jpeg_CreateCompress(in_RDI,0x50,0x248);
      in_RDI[5] = this;
      uVar3 = QImage::width();
      *(undefined4 *)(in_RDI + 6) = uVar3;
      uVar3 = QImage::height();
      *(undefined4 *)((long)in_RDI + 0x34) = uVar3;
      bVar11 = false;
      uVar3 = QImage::format();
      switch(uVar3) {
      case 1:
      case 2:
      case 3:
        local_278 = QImage::colorCount();
        for (bVar11 = true; bVar11 != false && local_278 != 0; bVar11 = (bVar11 & bVar1) != 0) {
          QList<unsigned_int>::operator[]
                    ((QList<unsigned_int> *)
                     CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
                     CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
          bVar1 = qIsGray(in_stack_fffffffffffffc54);
          local_278 = local_278 + -1;
        }
        uVar3 = 3;
        if (bVar11 != false) {
          uVar3 = 1;
        }
        *(undefined4 *)(in_RDI + 7) = uVar3;
        uVar3 = 2;
        if (bVar11 != false) {
          uVar3 = 1;
        }
        *(undefined4 *)((long)in_RDI + 0x3c) = uVar3;
        break;
      default:
        *(undefined4 *)(in_RDI + 7) = 3;
        *(undefined4 *)((long)in_RDI + 0x3c) = 2;
        break;
      case 0x18:
      case 0x1c:
        bVar11 = true;
        *(undefined4 *)(in_RDI + 7) = 1;
        *(undefined4 *)((long)in_RDI + 0x3c) = 1;
        break;
      case 0x24:
        *(undefined4 *)(in_RDI + 7) = 4;
        *(undefined4 *)((long)in_RDI + 0x3c) = 4;
      }
      jpeg_set_defaults(in_RDI);
      iVar2 = QImage::dotsPerMeterX();
      QImage::dotsPerMeterX();
      iVar4 = qRound(5.38225727332183e-318);
      local_1a0[0] = ((double)iVar2 * 2.54) / 100.0 - (double)iVar4;
      dVar12 = qAbs<double>(local_1a0);
      iVar2 = QImage::dotsPerMeterY();
      QImage::dotsPerMeterY();
      iVar4 = qRound(5.38292426194372e-318);
      local_1a8 = ((double)iVar2 * 2.54) / 100.0 - (double)iVar4;
      dVar13 = qAbs<double>(&local_1a8);
      iVar2 = QImage::dotsPerMeterX();
      QImage::dotsPerMeterX();
      iVar4 = qRound(5.38355172531393e-318);
      local_1b0 = (double)iVar2 / 100.0 - (double)iVar4;
      dVar14 = qAbs<double>(&local_1b0);
      iVar2 = QImage::dotsPerMeterY();
      QImage::dotsPerMeterY();
      iVar4 = qRound(5.38410013818082e-318);
      local_1b8 = (double)iVar2 / 100.0 - (double)iVar4;
      dVar15 = qAbs<double>(&local_1b8);
      if ((dVar14 + dVar15) * 2.54 <= dVar12 + dVar13) {
        *(undefined1 *)((long)in_RDI + 0x14a) = 2;
        iVar2 = QImage::dotsPerMeterX();
        *(short *)((long)in_RDI + 0x14c) = (short)((long)(iVar2 + 0x32) / 100);
        iVar2 = QImage::dotsPerMeterY();
        *(short *)((long)in_RDI + 0x14e) = (short)((iVar2 + 0x32) / 100);
      }
      else {
        *(undefined1 *)((long)in_RDI + 0x14a) = 1;
        QImage::dotsPerMeterX();
        iVar2 = qRound(5.38488570255771e-318);
        *(short *)((long)in_RDI + 0x14c) = (short)iVar2;
        QImage::dotsPerMeterY();
        iVar2 = qRound(5.38520190457104e-318);
        *(short *)((long)in_RDI + 0x14e) = (short)iVar2;
      }
      if ((in_stack_00000008 & 1) != 0) {
        *(undefined4 *)(in_RDI + 0x25) = 1;
      }
      if ((in_stack_00000010 & 1) != 0) {
        jpeg_simple_progression(in_RDI);
      }
      if (in_R8D < 0) {
        local_37c = 0x4b;
      }
      else {
        local_1c0 = 100;
        piVar6 = qMin<int>(&local_1bc,&local_1c0);
        local_37c = *piVar6;
      }
      jpeg_set_quality(in_RDI,local_37c,1);
      if (0x5a < local_37c) {
        *(undefined4 *)(in_RDI[0xd] + 0xc) = 1;
        *(undefined4 *)(in_RDI[0xd] + 8) = 1;
      }
      jpeg_start_compress(in_RDI,1);
      set_text(in_stack_fffffffffffffc60,in_stack_fffffffffffffc58,
               (QString *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50));
      if ((*(int *)((long)in_RDI + 0x3c) == 2) || (*(int *)((long)in_RDI + 0x3c) == 4)) {
        write_icc_profile(in_stack_fffffffffffffc78,in_stack_fffffffffffffc70);
      }
      pvVar7 = operator_new__((ulong)(uint)(*(int *)(in_RDI + 6) * *(int *)(in_RDI + 7)));
      *in_RSI = pvVar7;
      iVar2 = *(int *)(in_RDI + 6);
      while (*(uint *)((long)in_RDI + 0x154) < *(uint *)((long)in_RDI + 0x34)) {
        local_298 = (QImage *)*in_RSI;
        iVar4 = QImage::format();
        uVar9 = (ulong)(iVar4 - 1);
        iVar4 = (int)in_RDX;
        switch(uVar9) {
        case 0:
        case 1:
          if (bVar11 == false) {
            QImage::constScanLine(iVar4);
            iVar4 = QImage::format();
            if (iVar4 == 2) {
              for (local_2bc = 0; local_2bc < iVar2; local_2bc = local_2bc + 1) {
                puVar8 = QList<unsigned_int>::operator[]
                                   ((QList<unsigned_int> *)
                                    CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
                                    CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
                iVar4 = qRed(*puVar8);
                *local_298 = SUB41(iVar4,0);
                puVar8 = QList<unsigned_int>::operator[]
                                   ((QList<unsigned_int> *)
                                    CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
                                    CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
                iVar4 = qGreen(*puVar8);
                pQVar10 = local_298 + 2;
                local_298[1] = SUB41(iVar4,0);
                puVar8 = QList<unsigned_int>::operator[]
                                   ((QList<unsigned_int> *)
                                    CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
                                    CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
                iVar4 = qBlue(*puVar8);
                local_298 = local_298 + 3;
                *pQVar10 = SUB41(iVar4,0);
              }
            }
            else {
              for (local_2c4 = 0; local_2c4 < iVar2; local_2c4 = local_2c4 + 1) {
                puVar8 = QList<unsigned_int>::operator[]
                                   ((QList<unsigned_int> *)
                                    CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
                                    CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
                iVar4 = qRed(*puVar8);
                *local_298 = SUB41(iVar4,0);
                puVar8 = QList<unsigned_int>::operator[]
                                   ((QList<unsigned_int> *)
                                    CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
                                    CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
                iVar4 = qGreen(*puVar8);
                pQVar10 = local_298 + 2;
                local_298[1] = SUB41(iVar4,0);
                puVar8 = QList<unsigned_int>::operator[]
                                   ((QList<unsigned_int> *)
                                    CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
                                    CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
                iVar4 = qBlue(*puVar8);
                local_298 = local_298 + 3;
                *pQVar10 = SUB41(iVar4,0);
              }
            }
          }
          else {
            QImage::constScanLine(iVar4);
            iVar4 = QImage::format();
            if (iVar4 == 2) {
              for (local_2a4 = 0; local_2a4 < iVar2; local_2a4 = local_2a4 + 1) {
                puVar8 = QList<unsigned_int>::operator[]
                                   ((QList<unsigned_int> *)
                                    CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
                                    CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
                iVar4 = qRed(*puVar8);
                local_298[local_2a4] = SUB41(iVar4,0);
              }
            }
            else {
              for (local_2ac = 0; local_2ac < iVar2; local_2ac = local_2ac + 1) {
                puVar8 = QList<unsigned_int>::operator[]
                                   ((QList<unsigned_int> *)
                                    CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
                                    CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
                iVar4 = qRed(*puVar8);
                local_298[local_2ac] = SUB41(iVar4,0);
              }
            }
          }
          break;
        case 2:
          if (bVar11 == false) {
            QImage::constScanLine(iVar4);
            for (local_2e4 = 0; local_2e4 < iVar2; local_2e4 = local_2e4 + 1) {
              puVar8 = QList<unsigned_int>::operator[]
                                 ((QList<unsigned_int> *)
                                  CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
                                  CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
              iVar4 = qRed(*puVar8);
              *local_298 = SUB41(iVar4,0);
              puVar8 = QList<unsigned_int>::operator[]
                                 ((QList<unsigned_int> *)
                                  CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
                                  CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
              iVar4 = qGreen(*puVar8);
              pQVar10 = local_298 + 2;
              local_298[1] = SUB41(iVar4,0);
              puVar8 = QList<unsigned_int>::operator[]
                                 ((QList<unsigned_int> *)
                                  CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
                                  CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
              iVar4 = qBlue(*puVar8);
              local_298 = local_298 + 3;
              *pQVar10 = SUB41(iVar4,0);
            }
          }
          else {
            QImage::constScanLine(iVar4);
            for (local_2d4 = 0; local_2d4 < iVar2; local_2d4 = local_2d4 + 1) {
              puVar8 = QList<unsigned_int>::operator[]
                                 ((QList<unsigned_int> *)
                                  CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
                                  CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
              iVar4 = qRed(*puVar8);
              *local_298 = SUB41(iVar4,0);
              local_298 = local_298 + 1;
            }
          }
          break;
        case 3:
        case 4:
        case 5:
          local_2f0 = (QRgb *)QImage::constScanLine(iVar4);
          for (local_2f4 = 0; local_2f4 < iVar2; local_2f4 = local_2f4 + 1) {
            iVar4 = qRed(*local_2f0);
            *local_298 = SUB41(iVar4,0);
            iVar4 = qGreen(*local_2f0);
            pQVar10 = local_298 + 2;
            local_298[1] = SUB41(iVar4,0);
            iVar4 = qBlue(*local_2f0);
            local_298 = local_298 + 3;
            *pQVar10 = SUB41(iVar4,0);
            local_2f0 = local_2f0 + 1;
          }
          break;
        default:
          local_210 = 0xaaaaaaaaaaaaaaaa;
          local_208 = 0xaaaaaaaaaaaaaaaa;
          local_200 = 0xaaaaaaaaaaaaaaaa;
          QImage::copy(local_228,in_RDX,(EVP_PKEY_CTX *)0x0);
          QVar16.i = (Int)(uVar9 >> 0x20);
          QFlags<Qt::ImageConversionFlag>::QFlags
                    ((QFlags<Qt::ImageConversionFlag> *)
                     CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
                     in_stack_fffffffffffffc4c);
          QImage::convertToFormat
                    (in_stack_fffffffffffffc60,(Format)((ulong)in_stack_fffffffffffffc58 >> 0x20),
                     (ImageConversionFlags)QVar16.i);
          QImage::~QImage(local_228);
          local_318 = (QRgb *)QImage::constScanLine((int)&local_210);
          for (local_31c = 0; local_31c < iVar2; local_31c = local_31c + 1) {
            iVar4 = qRed(*local_318);
            *local_298 = SUB41(iVar4,0);
            iVar4 = qGreen(*local_318);
            pQVar10 = local_298 + 2;
            local_298[1] = SUB41(iVar4,0);
            iVar4 = qBlue(*local_318);
            local_298 = local_298 + 3;
            *pQVar10 = SUB41(iVar4,0);
            local_318 = local_318 + 1;
          }
          QImage::~QImage((QImage *)&local_210);
          break;
        case 0xc:
          pvVar7 = (void *)QImage::constScanLine(iVar4);
          memcpy(local_298,pvVar7,(long)(iVar2 * 3));
          in_stack_fffffffffffffc60 = local_298;
          break;
        case 0x17:
          pvVar7 = (void *)QImage::constScanLine(iVar4);
          memcpy(local_298,pvVar7,(long)iVar2);
          break;
        case 0x1b:
          local_1d8 = 0xaaaaaaaaaaaaaaaa;
          local_1d0 = 0xaaaaaaaaaaaaaaaa;
          local_1c8 = 0xaaaaaaaaaaaaaaaa;
          QImage::copy(local_1f0,in_RDX,(EVP_PKEY_CTX *)0x0);
          QVar16.i = (Int)(uVar9 >> 0x20);
          QFlags<Qt::ImageConversionFlag>::QFlags
                    ((QFlags<Qt::ImageConversionFlag> *)
                     CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
                     in_stack_fffffffffffffc4c);
          QImage::convertToFormat
                    (in_stack_fffffffffffffc60,(Format)((ulong)in_stack_fffffffffffffc58 >> 0x20),
                     (ImageConversionFlags)QVar16.i);
          QImage::~QImage(local_1f0);
          pvVar7 = (void *)QImage::constScanLine((int)&local_1d8);
          memcpy(local_298,pvVar7,(long)iVar2);
          QImage::~QImage((QImage *)&local_1d8);
          break;
        case 0x23:
          pvVar7 = (void *)QImage::constScanLine(iVar4);
          if ((in_stack_00000018 & 1) == 0) {
            memcpy(local_298,pvVar7,(long)(iVar2 << 2));
          }
          else {
            for (local_30c = 0; local_30c < iVar2; local_30c = local_30c + 1) {
              *(int *)(local_298 + (long)local_30c * 4) =
                   -1 - *(int *)((long)pvVar7 + (long)local_30c * 4);
            }
          }
        }
        jpeg_write_scanlines(in_RDI,in_RSI,1);
      }
      jpeg_finish_compress(in_RDI);
      jpeg_destroy_compress(in_RDI);
      local_264 = true;
    }
    else {
      my_output_message((j_common_ptr)CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48))
      ;
      jpeg_destroy_compress(in_RDI);
      local_264 = false;
    }
    if (this != (my_jpeg_destination_mgr *)0x0) {
      operator_delete(this,0x1030);
    }
    local_22d = local_264;
  }
  QList<unsigned_int>::~QList((QList<unsigned_int> *)0x10af91);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return local_22d;
  }
  __stack_chk_fail();
}

Assistant:

static bool do_write_jpeg_image(struct jpeg_compress_struct &cinfo,
                                JSAMPROW *row_pointer,
                                const QImage &image,
                                QIODevice *device,
                                int sourceQuality,
                                const QString &description,
                                bool optimize,
                                bool progressive,
                                bool invertCMYK)
{
    bool success = false;
    const QList<QRgb> cmap = image.colorTable();

    if (image.format() == QImage::Format_Invalid || image.format() == QImage::Format_Alpha8)
        return false;

    struct my_jpeg_destination_mgr *iod_dest = new my_jpeg_destination_mgr(device);
    struct my_error_mgr jerr;

    cinfo.err = jpeg_std_error(&jerr);
    jerr.error_exit = my_error_exit;
    jerr.output_message = my_output_message;

    if (!setjmp(jerr.setjmp_buffer)) {
        // WARNING:
        // this if loop is inside a setjmp/longjmp branch
        // do not create C++ temporaries here because the destructor may never be called
        // if you allocate memory, make sure that you can free it (row_pointer[0])
        jpeg_create_compress(&cinfo);

        cinfo.dest = iod_dest;

        cinfo.image_width = image.width();
        cinfo.image_height = image.height();

        bool gray = false;
        switch (image.format()) {
        case QImage::Format_Mono:
        case QImage::Format_MonoLSB:
        case QImage::Format_Indexed8:
            gray = true;
            for (int i = image.colorCount(); gray && i; i--) {
                gray = gray & qIsGray(cmap[i-1]);
            }
            cinfo.input_components = gray ? 1 : 3;
            cinfo.in_color_space = gray ? JCS_GRAYSCALE : JCS_RGB;
            break;
        case QImage::Format_Grayscale8:
        case QImage::Format_Grayscale16:
            gray = true;
            cinfo.input_components = 1;
            cinfo.in_color_space = JCS_GRAYSCALE;
            break;
        case QImage::Format_CMYK8888:
            cinfo.input_components = 4;
            cinfo.in_color_space = JCS_CMYK;
            break;
        default:
            cinfo.input_components = 3;
            cinfo.in_color_space = JCS_RGB;
        }

        jpeg_set_defaults(&cinfo);

        qreal diffInch = qAbs(image.dotsPerMeterX()*2.54/100. - qRound(image.dotsPerMeterX()*2.54/100.))
                         + qAbs(image.dotsPerMeterY()*2.54/100. - qRound(image.dotsPerMeterY()*2.54/100.));
        qreal diffCm = (qAbs(image.dotsPerMeterX()/100. - qRound(image.dotsPerMeterX()/100.))
                        + qAbs(image.dotsPerMeterY()/100. - qRound(image.dotsPerMeterY()/100.)))*2.54;
        if (diffInch < diffCm) {
            cinfo.density_unit = 1; // dots/inch
            cinfo.X_density = qRound(image.dotsPerMeterX()*2.54/100.);
            cinfo.Y_density = qRound(image.dotsPerMeterY()*2.54/100.);
        } else {
            cinfo.density_unit = 2; // dots/cm
            cinfo.X_density = (image.dotsPerMeterX()+50) / 100;
            cinfo.Y_density = (image.dotsPerMeterY()+50) / 100;
        }

        if (optimize)
            cinfo.optimize_coding = true;

        if (progressive)
            jpeg_simple_progression(&cinfo);

        int quality = sourceQuality >= 0 ? qMin(int(sourceQuality),100) : 75;
        jpeg_set_quality(&cinfo, quality, TRUE /* limit to baseline-JPEG values */);

        // If the quality exceeds a certain threshold (such as 90), disable chroma subsampling
        if (quality > 90) {
            cinfo.comp_info[0].v_samp_factor = 1;
            cinfo.comp_info[0].h_samp_factor = 1;
        }

        jpeg_start_compress(&cinfo, TRUE);

        set_text(image, &cinfo, description);
        if (cinfo.in_color_space == JCS_RGB || cinfo.in_color_space == JCS_CMYK)
            write_icc_profile(image, &cinfo);

        row_pointer[0] = new uchar[cinfo.image_width*cinfo.input_components];
        int w = cinfo.image_width;
        while (cinfo.next_scanline < cinfo.image_height) {
            uchar *row = row_pointer[0];
            switch (image.format()) {
            case QImage::Format_Mono:
            case QImage::Format_MonoLSB:
                if (gray) {
                    const uchar* data = image.constScanLine(cinfo.next_scanline);
                    if (image.format() == QImage::Format_MonoLSB) {
                        for (int i=0; i<w; i++) {
                            bool bit = !!(*(data + (i >> 3)) & (1 << (i & 7)));
                            row[i] = qRed(cmap[bit]);
                        }
                    } else {
                        for (int i=0; i<w; i++) {
                            bool bit = !!(*(data + (i >> 3)) & (1 << (7 -(i & 7))));
                            row[i] = qRed(cmap[bit]);
                        }
                    }
                } else {
                    const uchar* data = image.constScanLine(cinfo.next_scanline);
                    if (image.format() == QImage::Format_MonoLSB) {
                        for (int i=0; i<w; i++) {
                            bool bit = !!(*(data + (i >> 3)) & (1 << (i & 7)));
                            *row++ = qRed(cmap[bit]);
                            *row++ = qGreen(cmap[bit]);
                            *row++ = qBlue(cmap[bit]);
                        }
                    } else {
                        for (int i=0; i<w; i++) {
                            bool bit = !!(*(data + (i >> 3)) & (1 << (7 -(i & 7))));
                            *row++ = qRed(cmap[bit]);
                            *row++ = qGreen(cmap[bit]);
                            *row++ = qBlue(cmap[bit]);
                        }
                    }
                }
                break;
            case QImage::Format_Indexed8:
                if (gray) {
                    const uchar* pix = image.constScanLine(cinfo.next_scanline);
                    for (int i=0; i<w; i++) {
                        *row = qRed(cmap[*pix]);
                        ++row; ++pix;
                    }
                } else {
                    const uchar* pix = image.constScanLine(cinfo.next_scanline);
                    for (int i=0; i<w; i++) {
                        *row++ = qRed(cmap[*pix]);
                        *row++ = qGreen(cmap[*pix]);
                        *row++ = qBlue(cmap[*pix]);
                        ++pix;
                    }
                }
                break;
            case QImage::Format_Grayscale8:
                memcpy(row, image.constScanLine(cinfo.next_scanline), w);
                break;
            case QImage::Format_Grayscale16:
                {
                    QImage rowImg = image.copy(0, cinfo.next_scanline, w, 1).convertToFormat(QImage::Format_Grayscale8);
                    memcpy(row, rowImg.constScanLine(0), w);
                }
                break;
            case QImage::Format_RGB888:
                memcpy(row, image.constScanLine(cinfo.next_scanline), w * 3);
                break;
            case QImage::Format_RGB32:
            case QImage::Format_ARGB32:
            case QImage::Format_ARGB32_Premultiplied:
                {
                    const QRgb* rgb = (const QRgb*)image.constScanLine(cinfo.next_scanline);
                    for (int i=0; i<w; i++) {
                        *row++ = qRed(*rgb);
                        *row++ = qGreen(*rgb);
                        *row++ = qBlue(*rgb);
                        ++rgb;
                    }
                }
                break;
            case QImage::Format_CMYK8888: {
                auto *cmykIn = reinterpret_cast<const quint32 *>(image.constScanLine(cinfo.next_scanline));
                auto *cmykOut = reinterpret_cast<quint32 *>(row);
                if (invertCMYK) {
                    for (int i = 0; i < w; ++i)
                        cmykOut[i] = 0xffffffffu - cmykIn[i];
                } else {
                    memcpy(cmykOut, cmykIn, w * 4);
                }
                break;
            }
            default:
                {
                    // (Testing shows that this way is actually faster than converting to RGB888 + memcpy)
                    QImage rowImg = image.copy(0, cinfo.next_scanline, w, 1).convertToFormat(QImage::Format_RGB32);
                    const QRgb* rgb = (const QRgb*)rowImg.constScanLine(0);
                    for (int i=0; i<w; i++) {
                        *row++ = qRed(*rgb);
                        *row++ = qGreen(*rgb);
                        *row++ = qBlue(*rgb);
                        ++rgb;
                    }
                }
                break;
            }
            jpeg_write_scanlines(&cinfo, row_pointer, 1);
        }

        jpeg_finish_compress(&cinfo);
        jpeg_destroy_compress(&cinfo);
        success = true;
    } else {
        my_output_message(j_common_ptr(&cinfo));
        jpeg_destroy_compress(&cinfo);
        success = false;
    }

    delete iod_dest;
    return success;
}